

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int bn2binpad(BIGNUM *a,uchar *to,int tolen)

{
  int iVar1;
  int in_EDX;
  undefined1 *in_RSI;
  BIGNUM *in_RDI;
  unsigned_long l;
  int i;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  int local_4;
  
  iVar1 = BN_num_bits(in_RDI);
  local_20 = (iVar1 + 7) / 8;
  local_1c = local_20;
  if ((in_EDX == -1) || (local_1c = in_EDX, local_20 <= in_EDX)) {
    local_18 = in_RSI;
    if (local_20 < local_1c) {
      memset(in_RSI,0,(long)(local_1c - local_20));
      local_18 = in_RSI + (local_1c - local_20);
    }
    while (iVar1 = local_20 + -1, local_20 != 0) {
      *local_18 = (char)(in_RDI->d[iVar1 / 8] >> ((byte)(iVar1 % 8 << 3) & 0x3f));
      local_20 = iVar1;
      local_18 = local_18 + 1;
    }
    local_4 = local_1c;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int bn2binpad(const BIGNUM *a, unsigned char *to, int tolen)
{
    int i;
    BN_ULONG l;

    bn_check_top(a);
    i = BN_num_bytes(a);
    if (tolen == -1)
        tolen = i;
    else if (tolen < i)
        return -1;
    /* Add leading zeroes if necessary */
    if (tolen > i) {
        memset(to, 0, tolen - i);
        to += tolen - i;
    }
    while (i--) {
        l = a->d[i / BN_BYTES];
        *(to++) = (unsigned char)(l >> (8 * (i % BN_BYTES))) & 0xff;
    }
    return tolen;
}